

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.h
# Opt level: O2

void __thiscall QLineEditIconButton::~QLineEditIconButton(QLineEditIconButton *this)

{
  ~QLineEditIconButton((QLineEditIconButton *)&this[-1].m_opacity);
  return;
}

Assistant:

class Q_AUTOTEST_EXPORT QLineEditIconButton : public QToolButton
{
    Q_OBJECT
    Q_PROPERTY(qreal opacity READ opacity WRITE setOpacity)
public:
    explicit QLineEditIconButton(QWidget *parent =  nullptr);

    qreal opacity() const { return m_opacity; }
    void setOpacity(qreal value);
#if QT_CONFIG(animation)
    void animateShow(bool visible);

    bool shouldHideWithText() const;
    void setHideWithText(bool hide);
    bool needsSpace() const {
        if (m_fadingOut)
            return false;
        return isVisibleTo(parentWidget());
    }
#endif

protected:
    void actionEvent(QActionEvent *e) override;
    void paintEvent(QPaintEvent *event) override;

private slots:
    void updateCursor();

#if QT_CONFIG(animation)
    void onAnimationFinished();
#endif

private:
#if QT_CONFIG(animation)
    void startOpacityAnimation(qreal endValue);
#endif
    QLineEditPrivate *lineEditPrivate() const;

    qreal m_opacity;

#if QT_CONFIG(animation)
    bool m_hideWithText = false;
    bool m_fadingOut = false;
#endif

}